

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O3

void __thiscall GGSock::FileServer::~FileServer(FileServer *this)

{
  pointer ptVar1;
  _Head_base<0UL,_GGSock::FileServer::Impl_*,_false> __ptr;
  pointer ptVar2;
  
  LOCK();
  (((this->m_impl)._M_t.
    super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
    .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->isRunning)._M_base =
       (__atomic_base<bool>)0x0;
  UNLOCK();
  __ptr._M_head_impl =
       (this->m_impl)._M_t.
       super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
       .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
  ptVar2 = *(pointer *)
            &((__ptr._M_head_impl)->workers).
             super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl;
  ptVar1 = *(pointer *)((long)&(__ptr._M_head_impl)->workers + 8);
  if (ptVar2 != ptVar1) {
    do {
      std::thread::join();
      ptVar2 = ptVar2 + 1;
    } while (ptVar2 != ptVar1);
    __ptr._M_head_impl =
         (this->m_impl)._M_t.
         super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
         .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
    if (__ptr._M_head_impl == (Impl *)0x0) goto LAB_0010c447;
  }
  std::default_delete<GGSock::FileServer::Impl>::operator()
            ((default_delete<GGSock::FileServer::Impl> *)this,__ptr._M_head_impl);
LAB_0010c447:
  (this->m_impl)._M_t.
  super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>.
  _M_t.
  super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
  .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl = (Impl *)0x0;
  return;
}

Assistant:

FileServer::~FileServer() {
    m_impl->isRunning = false;

    for (auto & worker : m_impl->workers) {
        worker.join();
    }
}